

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O0

void __thiscall llvm::DWARFUnitIndex::dump(DWARFUnitIndex *this,raw_ostream *OS)

{
  bool bVar1;
  raw_ostream *prVar2;
  type pDVar3;
  uint in_R8D;
  undefined4 in_register_00000084;
  StringRef Str;
  uint local_ac;
  format_object<unsigned_int,_unsigned_int> local_a8;
  pointer local_90;
  SectionContribution *Contrib;
  uint i_3;
  pointer local_60;
  SectionContribution *Contribs;
  Entry *Row;
  uint i_2;
  uint i_1;
  char *local_40;
  FormattedString local_38;
  uint32_t local_1c;
  raw_ostream *prStack_18;
  uint i;
  raw_ostream *OS_local;
  DWARFUnitIndex *this_local;
  
  prStack_18 = OS;
  OS_local = (raw_ostream *)this;
  bVar1 = operator_cast_to_bool(this);
  if (bVar1) {
    Header::dump(&this->Header,prStack_18);
    raw_ostream::operator<<(prStack_18,"Index Signature         ");
    for (local_1c = 0; local_1c != (this->Header).NumColumns; local_1c = local_1c + 1) {
      prVar2 = raw_ostream::operator<<(prStack_18,' ');
      pDVar3 = std::
               unique_ptr<llvm::DWARFSectionKind[],_std::default_delete<llvm::DWARFSectionKind[]>_>
               ::operator[](&this->ColumnKinds,(ulong)local_1c);
      _i_2 = getColumnHeader(*pDVar3);
      Str.Length = 0x18;
      Str.Data = local_40;
      left_justify(&local_38,_i_2,Str,in_R8D);
      raw_ostream::operator<<(prVar2,&local_38);
    }
    raw_ostream::operator<<(prStack_18,"\n----- ------------------");
    for (Row._4_4_ = 0; Row._4_4_ != (this->Header).NumColumns; Row._4_4_ = Row._4_4_ + 1) {
      raw_ostream::operator<<(prStack_18," ------------------------");
    }
    raw_ostream::operator<<(prStack_18,'\n');
    for (Row._0_4_ = 0; (uint)Row != (this->Header).NumBuckets; Row._0_4_ = (uint)Row + 1) {
      Contribs = (SectionContribution *)
                 std::
                 unique_ptr<llvm::DWARFUnitIndex::Entry[],_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
                 ::operator[](&this->Rows,(ulong)(uint)Row);
      local_60 = std::
                 unique_ptr<llvm::DWARFUnitIndex::Entry::SectionContribution[],_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                 ::get(&((type)Contribs)->Contributions);
      prVar2 = prStack_18;
      if (local_60 != (pointer)0x0) {
        Contrib._4_4_ = (uint)Row + 1;
        format<unsigned_int,unsigned_long>
                  ((format_object<unsigned_int,_unsigned_long> *)&i_3,(llvm *)"%5u 0x%016lx ",
                   (char *)((long)&Contrib + 4),&Contribs[1].Offset,
                   (unsigned_long *)CONCAT44(in_register_00000084,in_R8D));
        raw_ostream::operator<<(prVar2,(format_object_base *)&i_3);
        for (Contrib._0_4_ = 0; prVar2 = prStack_18, (uint)Contrib != (this->Header).NumColumns;
            Contrib._0_4_ = (uint)Contrib + 1) {
          local_90 = local_60 + (uint)Contrib;
          local_ac = local_90->Offset + local_90->Length;
          format<unsigned_int,unsigned_int>
                    (&local_a8,(llvm *)"[0x%08x, 0x%08x) ",(char *)local_90,&local_ac,
                     (uint *)CONCAT44(in_register_00000084,in_R8D));
          raw_ostream::operator<<(prVar2,&local_a8.super_format_object_base);
        }
        raw_ostream::operator<<(prStack_18,'\n');
      }
    }
  }
  return;
}

Assistant:

void DWARFUnitIndex::dump(raw_ostream &OS) const {
  if (!*this)
    return;

  Header.dump(OS);
  OS << "Index Signature         ";
  for (unsigned i = 0; i != Header.NumColumns; ++i)
    OS << ' ' << left_justify(getColumnHeader(ColumnKinds[i]), 24);
  OS << "\n----- ------------------";
  for (unsigned i = 0; i != Header.NumColumns; ++i)
    OS << " ------------------------";
  OS << '\n';
  for (unsigned i = 0; i != Header.NumBuckets; ++i) {
    auto &Row = Rows[i];
    if (auto *Contribs = Row.Contributions.get()) {
      OS << format("%5u 0x%016" PRIx64 " ", i + 1, Row.Signature);
      for (unsigned i = 0; i != Header.NumColumns; ++i) {
        auto &Contrib = Contribs[i];
        OS << format("[0x%08x, 0x%08x) ", Contrib.Offset,
                     Contrib.Offset + Contrib.Length);
      }
      OS << '\n';
    }
  }
}